

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

void cfd::core::MergePsbtInputs(wally_psbt *psbt,wally_psbt *psbt_dest,bool ignore_duplicate_error)

{
  size_type *psVar1;
  pointer puVar2;
  uint uVar3;
  unsigned_long uVar4;
  ulong uVar5;
  bool bVar6;
  void *pvVar7;
  char cVar8;
  char cVar9;
  undefined8 *puVar10;
  CfdException *pCVar11;
  uint uVar12;
  size_t sVar13;
  undefined7 in_register_00000011;
  wally_tx_input *pwVar14;
  long lVar15;
  undefined8 uVar16;
  pointer puVar17;
  wally_tx_input *pwVar18;
  unsigned_long *puVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string item_key;
  string __str_1;
  Txid txid;
  vector<unsigned_long,_std::allocator<unsigned_long>_> append_indexes;
  int ret;
  undefined1 local_118 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  string local_f8;
  pointer *local_d8;
  uint local_d0;
  undefined4 uStack_cc;
  pointer local_c8 [2];
  wally_psbt *local_b8;
  wally_psbt *local_b0;
  undefined4 local_a4;
  undefined1 local_a0 [16];
  _func_int *local_90 [2];
  unsigned_long local_80;
  string local_78;
  unsigned_long *local_58;
  iterator iStack_50;
  unsigned_long *local_48;
  int local_3c;
  unsigned_long *local_38;
  
  local_48 = (unsigned_long *)0x0;
  local_58 = (unsigned_long *)0x0;
  iStack_50._M_current = (unsigned_long *)0x0;
  local_80 = 0;
  if (psbt_dest->num_inputs == 0) {
    return;
  }
  local_a4 = (undefined4)CONCAT71(in_register_00000011,ignore_duplicate_error);
  local_b8 = psbt_dest;
  local_b0 = psbt;
LAB_0047f1fc:
  sVar13 = local_b0->num_inputs;
  if (sVar13 != 0) {
    pwVar18 = local_b8->tx->inputs + local_80;
    pwVar14 = local_b0->tx->inputs;
    lVar15 = 0;
    do {
      if ((pwVar14->index == pwVar18->index) &&
         (auVar21[0] = -(pwVar18->txhash[0] == pwVar14->txhash[0]),
         auVar21[1] = -(pwVar18->txhash[1] == pwVar14->txhash[1]),
         auVar21[2] = -(pwVar18->txhash[2] == pwVar14->txhash[2]),
         auVar21[3] = -(pwVar18->txhash[3] == pwVar14->txhash[3]),
         auVar21[4] = -(pwVar18->txhash[4] == pwVar14->txhash[4]),
         auVar21[5] = -(pwVar18->txhash[5] == pwVar14->txhash[5]),
         auVar21[6] = -(pwVar18->txhash[6] == pwVar14->txhash[6]),
         auVar21[7] = -(pwVar18->txhash[7] == pwVar14->txhash[7]),
         auVar21[8] = -(pwVar18->txhash[8] == pwVar14->txhash[8]),
         auVar21[9] = -(pwVar18->txhash[9] == pwVar14->txhash[9]),
         auVar21[10] = -(pwVar18->txhash[10] == pwVar14->txhash[10]),
         auVar21[0xb] = -(pwVar18->txhash[0xb] == pwVar14->txhash[0xb]),
         auVar21[0xc] = -(pwVar18->txhash[0xc] == pwVar14->txhash[0xc]),
         auVar21[0xd] = -(pwVar18->txhash[0xd] == pwVar14->txhash[0xd]),
         auVar21[0xe] = -(pwVar18->txhash[0xe] == pwVar14->txhash[0xe]),
         auVar21[0xf] = -(pwVar18->txhash[0xf] == pwVar14->txhash[0xf]),
         auVar20[0] = -(pwVar18->txhash[0x10] == pwVar14->txhash[0x10]),
         auVar20[1] = -(pwVar18->txhash[0x11] == pwVar14->txhash[0x11]),
         auVar20[2] = -(pwVar18->txhash[0x12] == pwVar14->txhash[0x12]),
         auVar20[3] = -(pwVar18->txhash[0x13] == pwVar14->txhash[0x13]),
         auVar20[4] = -(pwVar18->txhash[0x14] == pwVar14->txhash[0x14]),
         auVar20[5] = -(pwVar18->txhash[0x15] == pwVar14->txhash[0x15]),
         auVar20[6] = -(pwVar18->txhash[0x16] == pwVar14->txhash[0x16]),
         auVar20[7] = -(pwVar18->txhash[0x17] == pwVar14->txhash[0x17]),
         auVar20[8] = -(pwVar18->txhash[0x18] == pwVar14->txhash[0x18]),
         auVar20[9] = -(pwVar18->txhash[0x19] == pwVar14->txhash[0x19]),
         auVar20[10] = -(pwVar18->txhash[0x1a] == pwVar14->txhash[0x1a]),
         auVar20[0xb] = -(pwVar18->txhash[0x1b] == pwVar14->txhash[0x1b]),
         auVar20[0xc] = -(pwVar18->txhash[0x1c] == pwVar14->txhash[0x1c]),
         auVar20[0xd] = -(pwVar18->txhash[0x1d] == pwVar14->txhash[0x1d]),
         auVar20[0xe] = -(pwVar18->txhash[0x1e] == pwVar14->txhash[0x1e]),
         auVar20[0xf] = -(pwVar18->txhash[0x1f] == pwVar14->txhash[0x1f]),
         auVar20 = auVar20 & auVar21,
         (ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) == 0xffff)) {
        ByteData::ByteData((ByteData *)local_118,pwVar14->txhash,0x20);
        ByteData256::ByteData256((ByteData256 *)&local_f8,(ByteData *)local_118);
        Txid::Txid((Txid *)local_a0,(ByteData256 *)&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_f8._M_dataplus._M_p,
                          local_f8.field_2._M_allocated_capacity - (long)local_f8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_118._0_8_,local_108._M_allocated_capacity - local_118._0_8_)
          ;
        }
        Txid::GetHex_abi_cxx11_(&local_78,(Txid *)local_a0);
        local_118._0_8_ = &local_108;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_118,local_78._M_dataplus._M_p,
                   local_78._M_dataplus._M_p + local_78._M_string_length);
        ::std::__cxx11::string::append(local_118);
        uVar3 = pwVar14->index;
        cVar9 = '\x01';
        if (uVar3 < 10) goto LAB_0047f3a9;
        uVar12 = uVar3;
        cVar8 = '\x04';
        goto LAB_0047f36c;
      }
      lVar15 = lVar15 + -0x110;
      pwVar14 = pwVar14 + 1;
      sVar13 = sVar13 - 1;
    } while (sVar13 != 0);
  }
  if (iStack_50._M_current == local_48) {
    ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_58,iStack_50,&local_80)
    ;
  }
  else {
    *iStack_50._M_current = local_80;
    iStack_50._M_current = iStack_50._M_current + 1;
  }
  goto LAB_0047f561;
  while( true ) {
    if (uVar12 < 10000) goto LAB_0047f3a9;
    bVar6 = uVar12 < 100000;
    uVar12 = uVar12 / 10000;
    cVar8 = cVar9 + '\x04';
    if (bVar6) break;
LAB_0047f36c:
    cVar9 = cVar8;
    if (uVar12 < 100) {
      cVar9 = cVar9 + -2;
      goto LAB_0047f3a9;
    }
    if (uVar12 < 1000) {
      cVar9 = cVar9 + -1;
      goto LAB_0047f3a9;
    }
  }
  cVar9 = cVar9 + '\x01';
LAB_0047f3a9:
  local_d8 = local_c8;
  ::std::__cxx11::string::_M_construct((ulong)&local_d8,cVar9);
  ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_d8,local_d0,uVar3);
  uVar16 = (pointer)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._0_8_ != &local_108) {
    uVar16 = local_108._M_allocated_capacity;
  }
  puVar2 = (pointer)(CONCAT44(uStack_cc,local_d0) + CONCAT44(local_118._12_4_,local_118._8_4_));
  if ((ulong)uVar16 < puVar2) {
    puVar17 = (pointer)0xf;
    if (local_d8 != local_c8) {
      puVar17 = local_c8[0];
    }
    if (puVar2 <= puVar17) {
      puVar10 = (undefined8 *)
                ::std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,local_118._0_8_);
      goto LAB_0047f438;
    }
  }
  puVar10 = (undefined8 *)::std::__cxx11::string::_M_append(local_118,(ulong)local_d8);
LAB_0047f438:
  psVar1 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_f8.field_2._M_allocated_capacity = *psVar1;
    local_f8.field_2._8_8_ = puVar10[3];
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  }
  else {
    local_f8.field_2._M_allocated_capacity = *psVar1;
    local_f8._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_f8._M_string_length = puVar10[1];
  *puVar10 = psVar1;
  puVar10[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_d8 != local_c8) {
    operator_delete(local_d8,(ulong)(local_c8[0] + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._0_8_ != &local_108) {
    operator_delete((void *)local_118._0_8_,(ulong)(local_108._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (pwVar14->sequence != pwVar18->sequence && SUB41(local_a4,0) == false) {
    local_118._0_8_ = "cfdcore_psbt.cpp";
    local_118._8_4_ = 0x26b;
    local_108._M_allocated_capacity = 0x6d6dd0;
    logger::log<std::__cxx11::string&>
              ((CfdSourceLocation *)local_118,kCfdLogLevelWarning,"psbt sequence duplicate. [{}]",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
    pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
    local_118._0_8_ = &local_108;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_118,"psbt sequence duplicate error.","");
    CfdException::CfdException(pCVar11,kCfdIllegalArgumentError,(string *)local_118);
    __cxa_throw(pCVar11,&CfdException::typeinfo,CfdException::~CfdException);
  }
  MergePsbtInputItem((wally_psbt_input *)((long)local_b0->inputs - lVar15),
                     local_b8->inputs + local_80,SUB41(local_a4,0),&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_a0._0_8_ = &PTR__Txid_007d4398;
  pvVar7 = (void *)CONCAT44(local_a0._12_4_,local_a0._8_4_);
  if (pvVar7 != (void *)0x0) {
    operator_delete(pvVar7,(long)local_90[1] - (long)pvVar7);
  }
LAB_0047f561:
  local_80 = local_80 + 1;
  if (local_b8->num_inputs <= local_80) goto code_r0x0047f583;
  goto LAB_0047f1fc;
code_r0x0047f583:
  local_38 = iStack_50._M_current;
  puVar19 = local_58;
  if (local_58 != iStack_50._M_current) {
    do {
      uVar4 = *puVar19;
      uVar5 = local_b0->num_inputs;
      local_3c = wally_psbt_add_input_at(local_b0,(uint32_t)uVar5,1,local_b8->tx->inputs + uVar4);
      if (local_3c != 0) {
        local_a0._0_8_ = "cfdcore_psbt.cpp";
        local_a0._8_4_ = 0x27f;
        local_90[0] = (_func_int *)0x6d6dd0;
        logger::log<int&>((CfdSourceLocation *)local_a0,kCfdLogLevelWarning,
                          "wally_psbt_add_input_at NG[{}]",&local_3c);
        pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
        local_a0._0_8_ = local_90;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_a0,"psbt add global unkonwns error.","");
        CfdException::CfdException(pCVar11,kCfdMemoryFullError,(string *)local_a0);
        __cxa_throw(pCVar11,&CfdException::typeinfo,CfdException::~CfdException);
      }
      pwVar14 = local_b8->tx->inputs + uVar4;
      ByteData::ByteData((ByteData *)local_118,pwVar14->txhash,0x20);
      ByteData256::ByteData256((ByteData256 *)&local_f8,(ByteData *)local_118);
      Txid::Txid((Txid *)local_a0,(ByteData256 *)&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_f8._M_dataplus._M_p,
                        local_f8.field_2._M_allocated_capacity - (long)local_f8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_118._0_8_,local_108._M_allocated_capacity - local_118._0_8_);
      }
      Txid::GetHex_abi_cxx11_(&local_78,(Txid *)local_a0);
      local_118._0_8_ = &local_108;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_118,local_78._M_dataplus._M_p,
                 local_78._M_dataplus._M_p + local_78._M_string_length);
      ::std::__cxx11::string::append(local_118);
      uVar3 = pwVar14->index;
      cVar9 = '\x01';
      if (9 < uVar3) {
        uVar12 = uVar3;
        cVar8 = '\x04';
        do {
          cVar9 = cVar8;
          if (uVar12 < 100) {
            cVar9 = cVar9 + -2;
            goto LAB_0047f6e6;
          }
          if (uVar12 < 1000) {
            cVar9 = cVar9 + -1;
            goto LAB_0047f6e6;
          }
          if (uVar12 < 10000) goto LAB_0047f6e6;
          bVar6 = 99999 < uVar12;
          uVar12 = uVar12 / 10000;
          cVar8 = cVar9 + '\x04';
        } while (bVar6);
        cVar9 = cVar9 + '\x01';
      }
LAB_0047f6e6:
      local_d8 = local_c8;
      ::std::__cxx11::string::_M_construct((ulong)&local_d8,cVar9);
      ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_d8,local_d0,uVar3);
      uVar16 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._0_8_ != &local_108) {
        uVar16 = local_108._M_allocated_capacity;
      }
      puVar2 = (pointer)(CONCAT44(uStack_cc,local_d0) + CONCAT44(local_118._12_4_,local_118._8_4_));
      if ((ulong)uVar16 < puVar2) {
        puVar17 = (pointer)0xf;
        if (local_d8 != local_c8) {
          puVar17 = local_c8[0];
        }
        if (puVar17 < puVar2) goto LAB_0047f757;
        puVar10 = (undefined8 *)
                  ::std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,local_118._0_8_);
      }
      else {
LAB_0047f757:
        puVar10 = (undefined8 *)::std::__cxx11::string::_M_append(local_118,(ulong)local_d8);
      }
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      psVar1 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_f8.field_2._M_allocated_capacity = *psVar1;
        local_f8.field_2._8_8_ = puVar10[3];
      }
      else {
        local_f8.field_2._M_allocated_capacity = *psVar1;
        local_f8._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_f8._M_string_length = puVar10[1];
      *puVar10 = psVar1;
      puVar10[1] = 0;
      *(undefined1 *)psVar1 = 0;
      if (local_d8 != local_c8) {
        operator_delete(local_d8,(ulong)(local_c8[0] + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._0_8_ != &local_108) {
        operator_delete((void *)local_118._0_8_,(ulong)(local_108._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      MergePsbtInputItem(local_b0->inputs + (uVar5 & 0xffffffff),local_b8->inputs + uVar4,
                         local_a4._0_1_,&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      local_a0._0_8_ = &PTR__Txid_007d4398;
      pvVar7 = (void *)CONCAT44(local_a0._12_4_,local_a0._8_4_);
      if (pvVar7 != (void *)0x0) {
        operator_delete(pvVar7,(long)local_90[1] - (long)pvVar7);
      }
      puVar19 = puVar19 + 1;
    } while (puVar19 != local_38);
  }
  if (local_58 != (unsigned_long *)0x0) {
    operator_delete(local_58,(long)local_48 - (long)local_58);
  }
  return;
}

Assistant:

void MergePsbtInputs(
    struct wally_psbt *psbt, const struct wally_psbt *psbt_dest,
    bool ignore_duplicate_error) {
  bool is_find;
  int ret;
  std::vector<size_t> append_indexes;
  for (size_t dst_idx = 0; dst_idx < psbt_dest->num_inputs; ++dst_idx) {
    auto dest_txin = &psbt_dest->tx->inputs[dst_idx];
    is_find = false;
    for (size_t src_idx = 0; src_idx < psbt->num_inputs; ++src_idx) {
      auto src_txin = &psbt->tx->inputs[src_idx];
      if ((src_txin->index == dest_txin->index) &&
          (memcmp(
               src_txin->txhash, dest_txin->txhash,
               sizeof(src_txin->txhash)) == 0)) {
        is_find = true;
        Txid txid(ByteData256(ByteData(
            src_txin->txhash,
            static_cast<uint32_t>(sizeof(src_txin->txhash)))));
        std::string item_key =
            txid.GetHex() + "," + std::to_string(src_txin->index);
        if (src_txin->sequence == dest_txin->sequence) {
          // do nothing
        } else if (ignore_duplicate_error) {
          // do nothing
        } else {
          warn(CFD_LOG_SOURCE, "psbt sequence duplicate. [{}]", item_key);
          throw CfdException(
              kCfdIllegalArgumentError, "psbt sequence duplicate error.");
        }
        MergePsbtInputItem(
            &psbt->inputs[src_idx], &psbt_dest->inputs[dst_idx],
            ignore_duplicate_error, item_key);
        break;
      }
    }
    if (!is_find) append_indexes.push_back(dst_idx);
  }

  uint32_t index;
  for (auto dst_idx : append_indexes) {
    index = static_cast<uint32_t>(psbt->num_inputs);
    ret = wally_psbt_add_input_at(
        psbt, index, WALLY_PSBT_FLAG_NON_FINAL,
        &psbt_dest->tx->inputs[dst_idx]);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_psbt_add_input_at NG[{}]", ret);
      throw CfdException(
          kCfdMemoryFullError, "psbt add global unkonwns error.");
    }
    auto dest_txin = &psbt_dest->tx->inputs[dst_idx];
    Txid txid(ByteData256(ByteData(
        dest_txin->txhash, static_cast<uint32_t>(sizeof(dest_txin->txhash)))));
    std::string item_key =
        txid.GetHex() + "," + std::to_string(dest_txin->index);
    MergePsbtInputItem(
        &psbt->inputs[index], &psbt_dest->inputs[dst_idx],
        ignore_duplicate_error, item_key);
  }
}